

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_slot_allocator_alloc(ma_slot_allocator *pAllocator,ma_uint64 *pSlot)

{
  ma_uint32 mVar1;
  uint uVar2;
  uint uVar3;
  ma_uint32 slotIndex;
  ma_uint32 bitOffset;
  ma_uint32 newBitfield;
  ma_uint32 oldBitfield;
  ma_uint32 iGroup;
  ma_uint32 maxAttempts;
  ma_uint32 iAttempt;
  ma_uint64 *pSlot_local;
  ma_slot_allocator *pAllocator_local;
  uint local_10;
  ma_uint32 cap;
  
  if ((pAllocator == (ma_slot_allocator *)0x0) || (pSlot == (ma_uint64 *)0x0)) {
    pAllocator_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    for (iGroup = 0; iGroup < 2; iGroup = iGroup + 1) {
      newBitfield = 0;
      while( true ) {
        local_10 = pAllocator->capacity >> 5;
        if ((pAllocator->capacity & 0x1f) != 0) {
          local_10 = local_10 + 1;
        }
        if (local_10 <= newBitfield) break;
        while (uVar3 = pAllocator->pGroups[newBitfield].bitfield, uVar3 != 0xffffffff) {
          mVar1 = ma_ffs_32(uVar3 ^ 0xffffffff);
          if (0x1f < mVar1) {
            __assert_fail("bitOffset < 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                          ,0x1550,
                          "ma_result ma_slot_allocator_alloc(ma_slot_allocator *, ma_uint64 *)");
          }
          LOCK();
          uVar2 = pAllocator->pGroups[newBitfield].bitfield;
          if (uVar3 == uVar2) {
            pAllocator->pGroups[newBitfield].bitfield = uVar3 | 1 << (mVar1 & 0x1f);
            uVar2 = uVar3;
          }
          UNLOCK();
          if (uVar2 == uVar3) {
            LOCK();
            pAllocator->count = pAllocator->count + 1;
            UNLOCK();
            uVar3 = newBitfield * 0x20 + mVar1;
            if (pAllocator->capacity <= uVar3) {
              return MA_OUT_OF_MEMORY;
            }
            pAllocator->pSlots[uVar3] = pAllocator->pSlots[uVar3] + 1;
            *pSlot = CONCAT44(pAllocator->pSlots[uVar3],uVar3);
            return MA_SUCCESS;
          }
        }
        newBitfield = newBitfield + 1;
      }
      if (pAllocator->capacity <= pAllocator->count) {
        return MA_OUT_OF_MEMORY;
      }
    }
    pAllocator_local._4_4_ = MA_OUT_OF_MEMORY;
  }
  return pAllocator_local._4_4_;
}

Assistant:

MA_API ma_result ma_slot_allocator_alloc(ma_slot_allocator* pAllocator, ma_uint64* pSlot)
{
    ma_uint32 iAttempt;
    const ma_uint32 maxAttempts = 2;    /* The number of iterations to perform until returning MA_OUT_OF_MEMORY if no slots can be found. */

    if (pAllocator == NULL || pSlot == NULL) {
        return MA_INVALID_ARGS;
    }

    for (iAttempt = 0; iAttempt < maxAttempts; iAttempt += 1) {
        /* We need to acquire a suitable bitfield first. This is a bitfield that's got an available slot within it. */
        ma_uint32 iGroup;
        for (iGroup = 0; iGroup < ma_slot_allocator_group_capacity(pAllocator); iGroup += 1) {
            /* CAS */
            for (;;) {
                ma_uint32 oldBitfield;
                ma_uint32 newBitfield;
                ma_uint32 bitOffset;

                oldBitfield = c89atomic_load_32(&pAllocator->pGroups[iGroup].bitfield);  /* <-- This copy must happen. The compiler must not optimize this away. */

                /* Fast check to see if anything is available. */
                if (oldBitfield == 0xFFFFFFFF) {
                    break;  /* No available bits in this bitfield. */
                }

                bitOffset = ma_ffs_32(~oldBitfield);
                MA_ASSERT(bitOffset < 32);

                newBitfield = oldBitfield | (1 << bitOffset);

                if (c89atomic_compare_and_swap_32(&pAllocator->pGroups[iGroup].bitfield, oldBitfield, newBitfield) == oldBitfield) {
                    ma_uint32 slotIndex;

                    /* Increment the counter as soon as possible to have other threads report out-of-memory sooner than later. */
                    c89atomic_fetch_add_32(&pAllocator->count, 1);

                    /* The slot index is required for constructing the output value. */
                    slotIndex = (iGroup << 5) + bitOffset;  /* iGroup << 5 = iGroup * 32 */
                    if (slotIndex >= pAllocator->capacity) {
                        return MA_OUT_OF_MEMORY;
                    }

                    /* Increment the reference count before constructing the output value. */
                    pAllocator->pSlots[slotIndex] += 1;

                    /* Construct the output value. */
                    *pSlot = (((ma_uint64)pAllocator->pSlots[slotIndex] << 32) | slotIndex);

                    return MA_SUCCESS;
                }
            }
        }

        /* We weren't able to find a slot. If it's because we've reached our capacity we need to return MA_OUT_OF_MEMORY. Otherwise we need to do another iteration and try again. */
        if (pAllocator->count < pAllocator->capacity) {
            ma_yield();
        } else {
            return MA_OUT_OF_MEMORY;
        }
    }

    /* We couldn't find a slot within the maximum number of attempts. */
    return MA_OUT_OF_MEMORY;
}